

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O3

double __thiscall Curve::getXofY(Curve *this,double y)

{
  double *pdVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (y <= *pdVar1) {
    dVar6 = *(this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    lVar4 = (long)(this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    uVar5 = lVar4 >> 3;
    if (1 < uVar5) {
      uVar3 = 1;
      do {
        if (y <= pdVar1[uVar3]) {
          dVar7 = pdVar1[uVar3] - pdVar1[uVar3 - 1];
          pdVar2 = (this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar6 = pdVar2[uVar3 - 1];
          if ((dVar7 == 0.0) && (!NAN(dVar7))) {
            return dVar6;
          }
          return (pdVar2[uVar3] - dVar6) * ((y - pdVar1[uVar3 - 1]) / dVar7) + dVar6;
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    dVar6 = *(double *)
             ((long)(this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4 + -8);
  }
  return dVar6;
}

Assistant:

double Curve::getXofY(double y)
// Assumes Y is increasing with X
{
    if ( y <= yData[0] ) return xData[0];

    for (vector<double>::size_type i = 1; i < yData.size(); i++)
    {
    	if ( y <= yData[i] )
    	{
            double dy = yData[i] - yData[i-1];
            if ( dy == 0.0 ) return xData[i-1];
            return xData[i-1] + (y - yData[i-1]) / dy * (xData[i] - xData[i-1]);
        }
    }
    return xData[yData.size()-1];
}